

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

bool __thiscall
S2BooleanOperation::Impl::AddBoundary
          (Impl *this,int a_region_id,bool invert_a,bool invert_b,bool invert_result,
          vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
          *a_chain_starts,CrossingProcessor *cp)

{
  S2ShapeIndex *pSVar1;
  S2ShapeIndex *b_index;
  ShapeEdgeId SVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  int extraout_var_00;
  ShapeEdgeId SVar7;
  ShapeEdgeId SVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  pointer local_90;
  CrossingIterator next_crossing;
  S2LogMessage local_40;
  S2Shape *pSVar6;
  
  pSVar1 = this->op_->regions_[a_region_id];
  b_index = this->op_->regions_[1 - a_region_id];
  bVar3 = GetIndexCrossings(this,a_region_id);
  if (bVar3) {
    CrossingProcessor::StartBoundary(cp,a_region_id,invert_a,invert_b,invert_result);
    local_90 = (a_chain_starts->
               super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
               )._M_impl.super__Vector_impl_data._M_start;
    CrossingIterator::CrossingIterator(&next_crossing,b_index,&this->index_crossings_,true);
    SVar7 = (next_crossing.it_._M_current)->a;
    SVar8 = *local_90;
    uVar10 = (ulong)SVar8 >> 0x20;
    if ((SVar7.shape_id < SVar8.shape_id) ||
       ((SVar7.shape_id <= SVar8.shape_id && (SVar7.edge_id < SVar8.edge_id)))) {
      SVar8 = (ShapeEdgeId)((ulong)SVar7 & 0xffffffff);
      uVar10 = (ulong)SVar7 >> 0x20;
    }
    while( true ) {
      iVar14 = SVar8.shape_id;
      bVar3 = kSentinel.edge_id == (int)uVar10 && kSentinel.shape_id == iVar14;
      if (bVar3) break;
      iVar4 = (*pSVar1->_vptr_S2ShapeIndex[3])(pSVar1,(ulong)SVar8 & 0xffffffff);
      pSVar6 = (S2Shape *)CONCAT44(extraout_var,iVar4);
      cp->a_shape_ = pSVar6;
      iVar4 = (*pSVar6->_vptr_S2Shape[4])();
      cp->a_dimension_ = iVar4;
      uVar12 = (ulong)SVar8 & 0xffffffff;
      SVar8 = (ShapeEdgeId)((ulong)SVar8 & 0xffffffff);
      while (SVar8.shape_id == iVar14) {
        uVar5 = (*pSVar6->_vptr_S2Shape[9])(pSVar6,uVar10);
        iVar4 = (*pSVar6->_vptr_S2Shape[7])(pSVar6,(ulong)uVar5);
        iVar13 = extraout_var_00 + iVar4;
        bVar15 = (*local_90).edge_id == (int)uVar10 && iVar14 == (*local_90).shape_id;
        uVar9 = (ulong)bVar15;
        local_90 = local_90 + uVar9;
        cp->chain_id_ = uVar5;
        cp->chain_start_ = iVar4;
        cp->chain_limit_ = iVar13;
        cp->inside_ = bVar15;
        cp->v0_emitted_max_edge_id_ = iVar4 + -1;
        cp->chain_v0_emitted_ = false;
        uVar11 = uVar10;
        while (iVar4 = (int)uVar11, iVar4 < iVar13) {
          if (((uVar9 & 1) == 0) &&
             ((iVar14 != ((next_crossing.it_._M_current)->a).shape_id ||
              (iVar4 != ((next_crossing.it_._M_current)->a).edge_id)))) {
            S2LogMessage::S2LogMessage
                      (&local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                       ,0x6e5,kFatal,(ostream *)&std::cerr);
            std::operator<<(local_40.stream_,
                            "Check failed: cp->inside() || next_crossing.a_id() == a_id ");
            abort();
          }
          bVar15 = CrossingProcessor::ProcessEdge
                             (cp,(ShapeEdgeId)(uVar11 << 0x20 | uVar12),&next_crossing);
          if (!bVar15) {
            return bVar3;
          }
          uVar9 = (ulong)cp->inside_;
          if (cp->inside_ == true) {
            uVar11 = (ulong)(iVar4 + 1);
          }
          else {
            SVar7 = (next_crossing.it_._M_current)->a;
            uVar11 = (ulong)SVar7 >> 0x20;
            if ((iVar14 != SVar7.shape_id) || (iVar13 <= SVar7.edge_id)) goto LAB_001e6d0b;
          }
        }
        SVar7 = (next_crossing.it_._M_current)->a;
        uVar11 = (ulong)SVar7 >> 0x20;
LAB_001e6d0b:
        SVar2 = *local_90;
        SVar8 = (ShapeEdgeId)((ulong)SVar7 & 0xffffffff);
        uVar10 = uVar11;
        if (SVar2.shape_id <= SVar7.shape_id) {
          SVar8 = (ShapeEdgeId)((ulong)SVar2 & 0xffffffff);
          uVar10 = (ulong)SVar2 >> 0x20;
          if ((SVar7.shape_id <= SVar2.shape_id) &&
             (SVar8 = (ShapeEdgeId)((ulong)SVar2 & 0xffffffff), (int)uVar11 < SVar2.edge_id)) {
            SVar8 = (ShapeEdgeId)((ulong)SVar7 & 0xffffffff);
            uVar10 = uVar11;
          }
        }
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool S2BooleanOperation::Impl::AddBoundary(
    int a_region_id, bool invert_a, bool invert_b, bool invert_result,
    const vector<ShapeEdgeId>& a_chain_starts, CrossingProcessor* cp) {
  const S2ShapeIndex& a_index = *op_->regions_[a_region_id];
  const S2ShapeIndex& b_index = *op_->regions_[1 - a_region_id];
  if (!GetIndexCrossings(a_region_id)) return false;
  cp->StartBoundary(a_region_id, invert_a, invert_b, invert_result);

  // Walk the boundary of region A and build a list of all edge crossings.
  // We also keep track of whether the current vertex is inside region B.
  auto next_start = a_chain_starts.begin();
  CrossingIterator next_crossing(&b_index, &index_crossings_,
                                 true /*crossings_complete*/);
  ShapeEdgeId next_id = min(*next_start, next_crossing.a_id());
  while (next_id != kSentinel) {
    int a_shape_id = next_id.shape_id;
    const S2Shape& a_shape = *a_index.shape(a_shape_id);
    cp->StartShape(&a_shape);
    while (next_id.shape_id == a_shape_id) {
      // TODO(ericv): Special handling of dimension 0?  Can omit most of this
      // code, including the loop, since all chains are of length 1.
      int edge_id = next_id.edge_id;
      S2Shape::ChainPosition chain_position = a_shape.chain_position(edge_id);
      int chain_id = chain_position.chain_id;
      S2Shape::Chain chain = a_shape.chain(chain_id);
      bool start_inside = (next_id == *next_start);
      if (start_inside) ++next_start;
      cp->StartChain(chain_id, chain, start_inside);
      int chain_limit = chain.start + chain.length;
      while (edge_id < chain_limit) {
        ShapeEdgeId a_id(a_shape_id, edge_id);
        S2_DCHECK(cp->inside() || next_crossing.a_id() == a_id);
        if (!cp->ProcessEdge(a_id, &next_crossing)) {
          return false;
        }
        if (cp->inside()) {
          ++edge_id;
        } else if (next_crossing.a_id().shape_id == a_shape_id &&
                   next_crossing.a_id().edge_id < chain_limit) {
          edge_id = next_crossing.a_id().edge_id;
        } else {
          break;
        }
      }
      next_id = min(*next_start, next_crossing.a_id());
    }
  }
  return true;
}